

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall AddrManImpl::SelectTriedCollision_(AddrManImpl *this)

{
  long lVar1;
  size_type sVar2;
  reference plVar3;
  size_type sVar4;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_RSI;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  int in_stack_0000000c;
  NetGroupManager *in_stack_00000010;
  uint256 *in_stack_00000018;
  AddrInfo *in_stack_00000020;
  AddrInfo *info_old;
  int tried_bucket_pos;
  int tried_bucket;
  AddrInfo *newInfo;
  nid_type id_new;
  iterator it;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_ffffffffffffff90;
  AddrInfo *__x;
  const_iterator __position;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffffb0;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *ppVar5;
  undefined1 fNew;
  uint256 *in_stack_ffffffffffffffe0;
  AddrInfo *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __position._M_node = (_Base_ptr)in_RDI;
  ppVar5 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_RDI,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
             (AnnotatedMixin<std::mutex> *)0xee7ebf);
  fNew = (undefined1)((ulong)ppVar5 >> 0x38);
  sVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::size
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (sVar2 == 0) {
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_true>
              (in_RSI);
  }
  else {
    std::set<long,_std::less<long>,_std::allocator<long>_>::begin(in_stack_ffffffffffffff90);
    __x = (AddrInfo *)&(in_RSI->first).nTime;
    std::set<long,_std::less<long>,_std::allocator<long>_>::size
              ((set<long,_std::less<long>,_std::allocator<long>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    RandomMixin<FastRandomContext>::randrange<unsigned_long>
              (in_stack_ffffffffffffffb0,(unsigned_long)in_RSI);
    std::advance<std::_Rb_tree_const_iterator<long>,unsigned_long>
              ((_Rb_tree_const_iterator<long> *)in_RSI,(unsigned_long)__position._M_node);
    plVar3 = std::_Rb_tree_const_iterator<long>::operator*
                       ((_Rb_tree_const_iterator<long> *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    this_00 = (AddrInfo *)*plVar3;
    sVar4 = std::
            unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
            ::count((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                     *)in_RDI,(key_type *)__x);
    if (sVar4 == 1) {
      std::
      unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
      ::operator[]((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                    *)in_RDI,(key_type *)__x);
      AddrInfo::GetTriedBucket(in_stack_00000020,in_stack_00000018,in_stack_00000010);
      AddrInfo::GetBucketPosition(this_00,in_stack_ffffffffffffffe0,(bool)fNew,in_stack_0000000c);
      std::
      unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
      ::operator[]((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                    *)in_RDI,(key_type *)__x);
      std::
      pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
      ::pair<const_AddrInfo_&,_true>
                (in_RDI,__x,
                 (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    else {
      std::set<long,std::less<long>,std::allocator<long>>::erase_abi_cxx11_
                ((set<long,_std::less<long>,_std::allocator<long>_> *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),__position);
      std::
      pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
      ::
      pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_true>
                (in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)__position._M_node;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::SelectTriedCollision_()
{
    AssertLockHeld(cs);

    if (m_tried_collisions.size() == 0) return {};

    std::set<nid_type>::iterator it = m_tried_collisions.begin();

    // Selects a random element from m_tried_collisions
    std::advance(it, insecure_rand.randrange(m_tried_collisions.size()));
    nid_type id_new = *it;

    // If id_new not found in mapInfo remove it from m_tried_collisions
    if (mapInfo.count(id_new) != 1) {
        m_tried_collisions.erase(it);
        return {};
    }

    const AddrInfo& newInfo = mapInfo[id_new];

    // which tried bucket to move the entry to
    int tried_bucket = newInfo.GetTriedBucket(nKey, m_netgroupman);
    int tried_bucket_pos = newInfo.GetBucketPosition(nKey, false, tried_bucket);

    const AddrInfo& info_old = mapInfo[vvTried[tried_bucket][tried_bucket_pos]];
    return {info_old, info_old.m_last_try};
}